

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

void duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined1 *puVar1;
  ValidityMask *this;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  unsigned_long *puVar8;
  float *pfVar9;
  list_entry_t *plVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var14;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var15;
  undefined4 uVar18;
  undefined4 uVar19;
  data_ptr_t pdVar16;
  undefined4 uVar20;
  undefined4 uVar21;
  pointer pcVar17;
  byte bVar22;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  undefined8 uVar23;
  undefined8 uVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  data_ptr_t pdVar26;
  bool bVar27;
  BoundFunctionExpression *pBVar28;
  reference vec;
  reference vec_00;
  idx_t iVar29;
  idx_t count;
  Vector *this_00;
  Vector *this_01;
  idx_t iVar30;
  TemplatedValidityData<unsigned_long> *pTVar31;
  SelectionVector *pSVar32;
  _Head_base<0UL,_unsigned_long_*,_false> _Var33;
  InvalidInputException *pIVar34;
  SelectionVector *pSVar35;
  SelectionVector *count_00;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  SelectionVector *pSVar40;
  ValidityMask *in_R8;
  idx_t in_R9;
  string *psVar41;
  ulong uVar42;
  idx_t idx_in_entry;
  uint64_t *puVar43;
  float fVar44;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t lVar45;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  UnifiedVectorFormat ldata;
  float *rhs_data;
  float *lhs_data;
  undefined1 local_138 [16];
  SelectionVector local_128 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  SelectionVector *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  DataChunk *local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  float *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count_00 = (SelectionVector *)args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_d8 = args;
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar29 = ListVector::GetListSize(vec);
  count = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this_00,iVar29);
  Vector::Flatten(this_01,count);
  FlatVector::VerifyFlatVector(this_00);
  iVar30 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,iVar29);
  if (iVar30 != iVar29) {
    pIVar34 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar17 = (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar17,
               pcVar17 + (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar34,(string *)local_138,&local_50);
    __cxa_throw(pIVar34,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_01);
  iVar29 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_01->validity).super_TemplatedValidityMask<unsigned_long>,count);
  if (iVar29 != count) {
    pIVar34 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar17 = (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar17,
               pcVar17 + (pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar34,(string *)local_138,&local_70);
    __cxa_throw(pIVar34,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar41 = &(pBVar28->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_78 = (undefined1  [8])this_00->data;
  local_80 = (float *)this_01->data;
  VVar2 = vec->vector_type;
  VVar3 = vec_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pfVar9 = (float *)result->data;
    if (((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) &&
       ((puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar8 == (unsigned_long *)0x0 || ((*puVar8 & 1) != 0)))) {
      fun.lhs_data = (float **)local_78;
      fun.func_name = psVar41;
      fun.rhs_data = &local_80;
      fVar44 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9);
      *pfVar9 = fVar44;
      goto LAB_01bb2025;
    }
  }
  else {
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      plVar10 = (list_entry_t *)vec_00->data;
      puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count_00;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count_00;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec->validity,(unsigned_long *)&local_c8
                    );
          uVar24 = local_138._8_8_;
          uVar23 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar23;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar31->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count_00[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar41;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              uVar36 = 0;
              pSVar40 = (SelectionVector *)0x0;
              do {
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar32 = (SelectionVector *)
                            &pSVar40[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar32) {
                    pSVar32 = count_00;
                  }
LAB_01bb1590:
                  pSVar35 = pSVar40;
                  if (pSVar40 < pSVar32) {
                    lVar45 = *plVar10;
                    puVar43 = (uint64_t *)(pdVar11 + (long)pSVar40 * 0x10 + 8);
                    do {
                      fun_01.lhs_data = (float **)local_78;
                      fun_01.func_name = psVar41;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar43;
                      left_00.offset = puVar43[-1];
                      fVar44 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_01,left_00,lVar45,in_R8,in_R9);
                      *(float *)(pdVar12 + (long)pSVar40 * 4) = fVar44;
                      pSVar40 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar43 = puVar43 + 2;
                      pSVar35 = pSVar32;
                    } while (pSVar32 != pSVar40);
                  }
                }
                else {
                  uVar37 = puVar8[uVar36];
                  pSVar32 = (SelectionVector *)
                            &pSVar40[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar32) {
                    pSVar32 = count_00;
                  }
                  pSVar35 = pSVar32;
                  if (uVar37 != 0) {
                    if (uVar37 == 0xffffffffffffffff) goto LAB_01bb1590;
                    pSVar35 = pSVar40;
                    if (pSVar40 < pSVar32) {
                      puVar43 = (uint64_t *)(pdVar11 + (long)pSVar40 * 0x10 + 8);
                      uVar39 = 0;
                      do {
                        if ((uVar37 >> (uVar39 & 0x3f) & 1) != 0) {
                          fun_00.lhs_data = (float **)local_78;
                          fun_00.func_name = psVar41;
                          fun_00.rhs_data = &local_80;
                          left.length = *puVar43;
                          left.offset = puVar43[-1];
                          fVar44 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                             (fun_00,left,*plVar10,in_R8,in_R9);
                          *(float *)(pdVar12 + uVar39 * 4 + (long)pSVar40 * 4) = fVar44;
                        }
                        uVar39 = uVar39 + 1;
                        puVar43 = puVar43 + 2;
                        pSVar35 = pSVar32;
                      } while ((long)pSVar32 - (long)pSVar40 != uVar39);
                    }
                  }
                }
                uVar36 = uVar36 + 1;
                pSVar40 = pSVar35;
              } while (uVar36 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bb2025;
          }
        }
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count_00 != (SelectionVector *)0x0) {
          lVar45 = *plVar10;
          puVar43 = (uint64_t *)(pdVar11 + 8);
          pSVar40 = (SelectionVector *)0x0;
          do {
            fun_05.lhs_data = (float **)local_138._8_8_;
            fun_05.func_name = (string *)local_138._0_8_;
            fun_05.rhs_data = (float **)local_128[0].sel_vector;
            left_02.length = *puVar43;
            left_02.offset = puVar43[-1];
            fVar44 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                               (fun_05,left_02,lVar45,in_R8,in_R9);
            *(float *)(pdVar12 + (long)pSVar40 * 4) = fVar44;
            pSVar40 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            puVar43 = puVar43 + 2;
          } while (count_00 != pSVar40);
        }
        goto LAB_01bb2025;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_138);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,(idx_t)count_00,(UnifiedVectorFormat *)local_138);
          Vector::ToUnifiedFormat(vec_00,(idx_t)count_00,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = local_c8.data;
          pSVar40 = local_c8.sel;
          uVar24 = local_138._8_8_;
          uVar23 = local_138._0_8_;
          pdVar11 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 && (float **)local_128[0].sel_vector == (float **)0x0) {
            if (count_00 != (SelectionVector *)0x0) {
              lVar38 = *(long *)uVar23;
              _Var15._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              pSVar40 = (SelectionVector *)0x0;
              do {
                pSVar32 = pSVar40;
                if (lVar38 != 0) {
                  pSVar32 = (SelectionVector *)(ulong)*(uint *)(lVar38 + (long)pSVar40 * 4);
                }
                pSVar35 = pSVar40;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var15._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar35 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var15._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar40 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))
                        ->_M_use_count;
                uVar18 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))
                         ->_M_weak_count;
                left_01.length._4_4_ = uVar18;
                left_01.length._0_4_ = uVar4;
                uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar35 * 0x10))->_M_use_count;
                uVar19 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar35 * 0x10))->_M_weak_count;
                right.length._4_4_ = uVar19;
                right.length._0_4_ = uVar5;
                fun_02.lhs_data = (float **)local_78;
                fun_02.func_name = psVar41;
                fun_02.rhs_data = &local_80;
                left_01.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))->
                     _vptr__Sp_counted_base;
                right.offset = (uint64_t)
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pdVar12 + pSVar35 * 0x10))->_vptr__Sp_counted_base;
                fVar44 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_02,left_01,right,in_R8,in_R9);
                *(float *)(pdVar11 + (long)pSVar40 * 4) = fVar44;
                pSVar40 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
              } while (count_00 != pSVar40);
            }
          }
          else if (count_00 != (SelectionVector *)0x0) {
            lVar38 = *(long *)uVar23;
            _Var15._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pSVar40 = (SelectionVector *)0x0;
            do {
              pSVar32 = pSVar40;
              if (lVar38 != 0) {
                pSVar32 = (SelectionVector *)(ulong)*(uint *)(lVar38 + (long)pSVar40 * 4);
              }
              pSVar35 = pSVar40;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var15._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar35 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var15._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar40 * 4);
              }
              if ((((float **)local_128[0].sel_vector == (float **)0x0) ||
                  (((ulong)*(float **)((long)local_128[0].sel_vector + ((ulong)pSVar32 >> 6) * 8) >>
                    ((ulong)pSVar32 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar35 >> 6] >> ((ulong)pSVar35 & 0x3f) & 1) != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))
                        ->_M_use_count;
                uVar20 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar20;
                left_03.length._0_4_ = uVar6;
                uVar7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar35 * 0x10))->_M_use_count;
                uVar21 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar35 * 0x10))->_M_weak_count;
                right_01.length._4_4_ = uVar21;
                right_01.length._0_4_ = uVar7;
                fun_06.lhs_data = (float **)local_78;
                fun_06.func_name = psVar41;
                fun_06.rhs_data = &local_80;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar32 * 0x10))->
                     _vptr__Sp_counted_base;
                right_01.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pdVar12 + pSVar35 * 0x10))->_vptr__Sp_counted_base;
                fVar44 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_06,left_03,right_01,in_R8,in_R9);
                *(float *)(pdVar11 + (long)pSVar40 * 4) = fVar44;
              }
              else {
                _Var33._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var33._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var25 = p_Stack_e0;
                  pSVar32 = local_e8;
                  local_e8 = (SelectionVector *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar32;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var25;
                  if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var33._M_head_impl =
                       (pTVar31->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var33._M_head_impl;
                }
                bVar22 = (byte)pSVar40 & 0x3f;
                _Var33._M_head_impl[(ulong)pSVar40 >> 6] =
                     _Var33._M_head_impl[(ulong)pSVar40 >> 6] &
                     (-2L << bVar22 | 0xfffffffffffffffeU >> 0x40 - bVar22);
              }
              pSVar40 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
            } while (count_00 != pSVar40);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
          }
          if (local_128[0].selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128[0].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_01bb2025;
        }
        pdVar11 = vec->data;
        pdVar12 = vec_00->data;
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar16 = result->data;
        FlatVector::VerifyFlatVector(result);
        this = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        local_e8 = count_00;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
LAB_01bb1db2:
          FlatVector::VerifyFlatVector(vec_00);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
          if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8 = count_00;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var33._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_e8 = count_00;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vec_00->validity,
                       (unsigned_long *)&local_e8);
            pdVar26 = local_c8.data;
            pSVar40 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar40;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
            if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var33._M_head_impl =
                 (pTVar31->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var33._M_head_impl;
        }
        else {
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vec->validity,(unsigned_long *)&local_e8
                    );
          pdVar26 = local_c8.data;
          pSVar40 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar40;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar31->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
              (unsigned_long *)0x0) goto LAB_01bb1db2;
          FlatVector::VerifyFlatVector(vec_00);
          ValidityMask::Combine(this,&vec_00->validity,(idx_t)count_00);
          _Var33._M_head_impl = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        }
        if (_Var33._M_head_impl == (unsigned_long *)0x0) {
          if (count_00 != (SelectionVector *)0x0) {
            lVar38 = 0;
            do {
              fun_10.lhs_data = (float **)local_138._8_8_;
              fun_10.func_name = (string *)local_138._0_8_;
              fun_10.rhs_data = (float **)local_128[0].sel_vector;
              left_06.length = *(uint64_t *)(pdVar11 + lVar38 * 4 + 8);
              left_06.offset = *(uint64_t *)(pdVar11 + lVar38 * 4);
              right_05.length = *(uint64_t *)(pdVar12 + lVar38 * 4 + 8);
              right_05.offset = *(uint64_t *)(pdVar12 + lVar38 * 4);
              fVar44 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_10,left_06,right_05,in_R8,in_R9);
              *(float *)(pdVar16 + lVar38) = fVar44;
              lVar38 = lVar38 + 4;
              count_00 = (SelectionVector *)
                         ((long)&count_00[-1].selection_data.internal.
                                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7);
            } while (count_00 != (SelectionVector *)0x0);
          }
        }
        else {
          puVar1 = (undefined1 *)
                   ((long)&count_00[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar1) {
            pSVar40 = (SelectionVector *)0x0;
            uVar36 = 0;
            do {
              puVar8 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                pSVar32 = (SelectionVector *)
                          &pSVar40[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count_00 <= pSVar32) {
                  pSVar32 = count_00;
                }
LAB_01bb1ecd:
                pSVar35 = pSVar40;
                if (pSVar40 < pSVar32) {
                  uVar37 = (long)pSVar40 << 4 | 8;
                  do {
                    fun_08.lhs_data = (float **)local_138._8_8_;
                    fun_08.func_name = (string *)local_138._0_8_;
                    fun_08.rhs_data = (float **)local_128[0].sel_vector;
                    left_04.length = *(uint64_t *)(pdVar11 + uVar37);
                    left_04.offset = *(uint64_t *)(pdVar11 + (uVar37 - 8));
                    right_03.length = *(uint64_t *)(pdVar12 + uVar37);
                    right_03.offset = *(uint64_t *)(pdVar12 + (uVar37 - 8));
                    fVar44 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                       (fun_08,left_04,right_03,in_R8,in_R9);
                    *(float *)(pdVar16 + (long)pSVar40 * 4) = fVar44;
                    pSVar40 = (SelectionVector *)
                              ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)
                                      ->
                                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                      )._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t + 1);
                    uVar37 = uVar37 + 0x10;
                    pSVar35 = pSVar32;
                  } while (pSVar32 != pSVar40);
                }
              }
              else {
                uVar37 = puVar8[uVar36];
                pSVar32 = (SelectionVector *)
                          &pSVar40[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count_00 <= pSVar32) {
                  pSVar32 = count_00;
                }
                pSVar35 = pSVar32;
                if (uVar37 != 0) {
                  if (uVar37 == 0xffffffffffffffff) goto LAB_01bb1ecd;
                  pSVar35 = pSVar40;
                  if (pSVar40 < pSVar32) {
                    uVar42 = (long)pSVar40 << 4 | 8;
                    uVar39 = 0;
                    do {
                      if ((uVar37 >> (uVar39 & 0x3f) & 1) != 0) {
                        fun_09.lhs_data = (float **)local_138._8_8_;
                        fun_09.func_name = (string *)local_138._0_8_;
                        fun_09.rhs_data = (float **)local_128[0].sel_vector;
                        left_05.length = *(uint64_t *)(pdVar11 + uVar42);
                        left_05.offset = *(uint64_t *)(pdVar11 + (uVar42 - 8));
                        right_04.length = *(uint64_t *)(pdVar12 + uVar42);
                        right_04.offset = *(uint64_t *)(pdVar12 + (uVar42 - 8));
                        fVar44 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                           (fun_09,left_05,right_04,in_R8,in_R9);
                        *(float *)(pdVar16 + uVar39 * 4 + (long)pSVar40 * 4) = fVar44;
                      }
                      uVar39 = uVar39 + 1;
                      uVar42 = uVar42 + 0x10;
                      pSVar35 = pSVar32;
                    } while ((long)pSVar32 - (long)pSVar40 != uVar39);
                  }
                }
              }
              pSVar40 = pSVar35;
              uVar36 = uVar36 + 1;
            } while (uVar36 != (ulong)puVar1 >> 6);
          }
        }
        goto LAB_01bb2025;
      }
      plVar10 = (list_entry_t *)vec->data;
      puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec_00->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count_00;
        if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count_00;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = count_00;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec_00->validity,
                     (unsigned_long *)&local_c8);
          uVar24 = local_138._8_8_;
          uVar23 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar23;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar31 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar31->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count_00[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar41;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              uVar36 = 0;
              pSVar40 = (SelectionVector *)0x0;
              do {
                puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar32 = (SelectionVector *)
                            &pSVar40[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar32) {
                    pSVar32 = count_00;
                  }
LAB_01bb1901:
                  pSVar35 = pSVar40;
                  if (pSVar40 < pSVar32) {
                    lVar45 = *plVar10;
                    puVar43 = (uint64_t *)(pdVar11 + (long)pSVar40 * 0x10 + 8);
                    do {
                      fun_04.lhs_data = (float **)local_78;
                      fun_04.func_name = psVar41;
                      fun_04.rhs_data = &local_80;
                      right_00.length = *puVar43;
                      right_00.offset = puVar43[-1];
                      fVar44 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_04,lVar45,right_00,in_R8,in_R9);
                      *(float *)(pdVar12 + (long)pSVar40 * 4) = fVar44;
                      pSVar40 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar43 = puVar43 + 2;
                      pSVar35 = pSVar32;
                    } while (pSVar32 != pSVar40);
                  }
                }
                else {
                  uVar37 = puVar8[uVar36];
                  pSVar32 = (SelectionVector *)
                            &pSVar40[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count_00 <= pSVar32) {
                    pSVar32 = count_00;
                  }
                  pSVar35 = pSVar32;
                  if (uVar37 != 0) {
                    if (uVar37 == 0xffffffffffffffff) goto LAB_01bb1901;
                    pSVar35 = pSVar40;
                    if (pSVar40 < pSVar32) {
                      puVar43 = (uint64_t *)(pdVar11 + (long)pSVar40 * 0x10 + 8);
                      uVar39 = 0;
                      do {
                        if ((uVar37 >> (uVar39 & 0x3f) & 1) != 0) {
                          fun_03.lhs_data = (float **)local_78;
                          fun_03.func_name = psVar41;
                          fun_03.rhs_data = &local_80;
                          lVar45.length = *puVar43;
                          lVar45.offset = puVar43[-1];
                          fVar44 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                             (fun_03,*plVar10,lVar45,in_R8,in_R9);
                          *(float *)(pdVar12 + uVar39 * 4 + (long)pSVar40 * 4) = fVar44;
                        }
                        uVar39 = uVar39 + 1;
                        puVar43 = puVar43 + 2;
                        pSVar35 = pSVar32;
                      } while ((long)pSVar32 - (long)pSVar40 != uVar39);
                    }
                  }
                }
                uVar36 = uVar36 + 1;
                pSVar40 = pSVar35;
              } while (uVar36 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bb2025;
          }
        }
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count_00 != (SelectionVector *)0x0) {
          lVar45 = *plVar10;
          puVar43 = (uint64_t *)(pdVar11 + 8);
          pSVar40 = (SelectionVector *)0x0;
          do {
            fun_07.lhs_data = (float **)local_138._8_8_;
            fun_07.func_name = (string *)local_138._0_8_;
            fun_07.rhs_data = (float **)local_128[0].sel_vector;
            right_02.length = *puVar43;
            right_02.offset = puVar43[-1];
            fVar44 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                               (fun_07,lVar45,right_02,in_R8,in_R9);
            *(float *)(pdVar12 + (long)pSVar40 * 4) = fVar44;
            pSVar40 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar40->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            puVar43 = puVar43 + 2;
          } while (count_00 != pSVar40);
        }
        goto LAB_01bb2025;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01bb2025:
  bVar27 = DataChunk::AllConstant(local_d8);
  if (bVar27) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}